

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O2

void __thiscall OutputRedirect::OutputRedirect(OutputRedirect *this,FILE *f)

{
  int __fd;
  undefined8 in_RAX;
  int __fd2;
  int __fd_00;
  file write_end;
  undefined8 local_28;
  
  this->file_ = f;
  this->original_ = -1;
  this->read_end_ = -1;
  local_28 = in_RAX;
  flush(this);
  __fd = fileno((FILE *)f);
  __fd_00 = __fd;
  fmt::v5::file::dup((file *)((long)&local_28 + 4),__fd);
  fmt::v5::file::close(&this->original_,__fd_00);
  (this->original_).fd_ = local_28._4_4_;
  local_28._4_4_ = 0xffffffff;
  fmt::v5::file::~file((file *)((long)&local_28 + 4));
  local_28 = CONCAT44(local_28._4_4_,0xffffffff);
  fmt::v5::file::pipe(&this->read_end_,(int *)&local_28);
  fmt::v5::file::dup2((file *)&local_28,__fd,__fd2);
  fmt::v5::file::~file((file *)&local_28);
  return;
}

Assistant:

OutputRedirect::OutputRedirect(FILE *f) : file_(f) {
  flush();
  int fd = FMT_POSIX(fileno(f));
  // Create a file object referring to the original file.
  original_ = file::dup(fd);
  // Create a pipe.
  file write_end;
  file::pipe(read_end_, write_end);
  // Connect the passed FILE object to the write end of the pipe.
  write_end.dup2(fd);
}